

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

ER __thiscall slang::ast::CaseStatement::evalImpl(CaseStatement *this,EvalContext *context)

{
  Statement *this_00;
  EvalContext *context_00;
  type_conflict1 *success;
  type *matchedStmt;
  EvalContext *in_stack_000001c8;
  CaseStatement *in_stack_000001d0;
  ER local_4;
  
  getKnownBranch(in_stack_000001d0,in_stack_000001c8);
  this_00 = (Statement *)
            std::get<0ul,slang::ast::Statement_const*,bool>
                      ((pair<const_slang::ast::Statement_*,_bool> *)0xbd11d2);
  context_00 = (EvalContext *)
               std::get<1ul,slang::ast::Statement_const*,bool>
                         ((pair<const_slang::ast::Statement_*,_bool> *)0xbd11e1);
  if (((ulong)(context_00->astCtx).scope.ptr & 1) == 0) {
    local_4 = Fail;
  }
  else if (*(long *)this_00 == 0) {
    local_4 = Success;
  }
  else {
    local_4 = Statement::eval(this_00,context_00);
  }
  return local_4;
}

Assistant:

ER CaseStatement::evalImpl(EvalContext& context) const {
    auto [matchedStmt, success] = getKnownBranch(context);
    if (!success)
        return ER::Fail;

    if (matchedStmt)
        return matchedStmt->eval(context);

    return ER::Success;
}